

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

void __thiscall
kj::(anonymous_namespace)::DiskAppendableFile::~DiskAppendableFile(DiskAppendableFile *this)

{
  FdOutputStream::~FdOutputStream((FdOutputStream *)this);
  AutoCloseFd::~AutoCloseFd((AutoCloseFd *)(this + -8));
  ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)(this + -0x10));
  operator_delete(this + -0x18,0x30);
  return;
}

Assistant:

DiskAppendableFile(AutoCloseFd&& fd)
      : DiskHandle(kj::mv(fd)),
        FdOutputStream(DiskHandle::fd.get()) {}